

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

void __thiscall BasicBlock::CheckLegalityAndFoldPathDepBranches(BasicBlock *this,GlobOpt *globOpt)

{
  Func **ppFVar1;
  IRKind IVar2;
  Type TVar3;
  uint uVar4;
  uint uVar5;
  LabelInstr *pLVar6;
  Type pJVar7;
  Opnd *this_00;
  Instr *pIVar8;
  Func *func;
  code *pcVar9;
  NodeBase *pNVar10;
  bool bVar11;
  BOOLEAN BVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint32 offset;
  long lVar16;
  ValueHashTable<Sym_*,_Value_*> *this_01;
  BVSparse<Memory::JitArenaAllocator> *this_02;
  LabelInstr *pLVar17;
  RegOpnd *this_03;
  StackSym *pSVar18;
  Value *pVVar19;
  Value **ppVVar20;
  BranchInstr *pBVar21;
  LabelInstr *pLVar22;
  BasicBlock *pBVar23;
  JITTimeFunctionBody *this_04;
  char16 *pcVar24;
  long lVar25;
  ByteCodeUsesInstr *instr;
  Instr *instr_00;
  Type *ppFVar26;
  Func **ppFVar27;
  LabelInstr *this_05;
  Instr **ppIVar28;
  BVSparse<Memory::JitArenaAllocator> *pBVar29;
  undefined1 local_90 [8];
  EditingIterator iter;
  LabelInstr *local_58;
  
  pBVar23 = this->next;
  ppFVar1 = &this->func;
  ppFVar27 = (Func **)&pBVar23->firstInstr;
  if (pBVar23 == (BasicBlock *)0x0) {
    ppFVar27 = ppFVar1;
  }
  lVar16 = 0xd0;
  if (pBVar23 != (BasicBlock *)0x0) {
    lVar16 = 0x18;
  }
  lVar16 = *(long *)((long)&(*ppFVar27)->m_alloc + lVar16);
  if (lVar16 == 0) {
    pLVar22 = (LabelInstr *)0x0;
  }
  else {
    pLVar22 = *(LabelInstr **)(lVar16 + 0x10);
  }
  iter.last = (NodeBase *)__tls_get_addr(&PTR_013e5f18);
  local_58 = (LabelInstr *)0x0;
  this_05 = (LabelInstr *)0x0;
  ppIVar28 = &this->firstInstr;
  pLVar17 = (LabelInstr *)0x0;
  while (pLVar6 = (LabelInstr *)*ppIVar28, pLVar6 != pLVar22) {
    if ((pLVar17 != (LabelInstr *)0x0) && ((LabelInstr *)(pLVar17->super_Instr).m_next != pLVar6)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      pNVar10 = iter.last;
      *(undefined4 *)&(iter.last)->next = 1;
      bVar11 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                          ,0x1250,
                          "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instr)",
                          "Modifying instr list but not using EDITING iterator!");
      if (!bVar11) {
LAB_0040006e:
        pcVar9 = (code *)invalidInstructionException();
        (*pcVar9)();
      }
      *(undefined4 *)&pNVar10->next = 0;
    }
    bVar11 = OpCodeAttr::HasDeadFallThrough((pLVar6->super_Instr).m_opcode);
    if (bVar11) {
      return;
    }
    if ((pLVar6->super_Instr).m_opcode == InlineeEnd) {
      this_05 = pLVar6;
      local_58 = pLVar6;
    }
    pLVar17 = pLVar6;
    ppIVar28 = &(pLVar6->super_Instr).m_next;
  }
  pBVar23 = this->next;
  ppFVar27 = (Func **)&pBVar23->firstInstr;
  if (pBVar23 == (BasicBlock *)0x0) {
    ppFVar27 = ppFVar1;
  }
  lVar16 = 0x18;
  if (pBVar23 == (BasicBlock *)0x0) {
    lVar16 = 0xd0;
  }
  pLVar22 = *(LabelInstr **)((long)&(*ppFVar27)->m_alloc + lVar16);
  bVar11 = IsLegalForPathDepBranches(&pLVar22->super_Instr);
  if (!bVar11) {
    return;
  }
  this_01 = ValueHashTable<Sym_*,_Value_*>::New(globOpt->tempAlloc,8);
  this_02 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,globOpt->tempAlloc,0x3d6ef4);
  pJVar7 = globOpt->tempAlloc;
  this_02->head = (Type_conflict)0x0;
  this_02->lastFoundIndex = (Type_conflict)0x0;
  this_02->alloc = pJVar7;
  this_02->lastUsedNodePrevNextField = (Type)this_02;
LAB_003ffab5:
  while( true ) {
    if (pLVar22 == (LabelInstr *)0x0) {
      return;
    }
    uVar13 = (uint)(pLVar22->super_Instr).m_kind;
    if (((5 < uVar13) || ((0x2cU >> (uVar13 & 0x1f) & 1) == 0)) &&
       (bVar11 = IsLegalOpcodeForPathDepBrFold(&pLVar22->super_Instr), !bVar11)) {
      return;
    }
    bVar11 = OpCodeAttr::HasDeadFallThrough((pLVar22->super_Instr).m_opcode);
    if (bVar11) {
      return;
    }
    IVar2 = (pLVar22->super_Instr).m_kind;
    if (((IVar2 == InstrKindProfiledLabel) || (IVar2 == InstrKindLabel)) &&
       (pLVar17 = IR::Instr::AsLabelInstr(&pLVar22->super_Instr), (pLVar17->field_0x78 & 1) != 0)) {
      return;
    }
    if ((pLVar22->super_Instr).m_opcode == InlineeEnd) {
      bVar11 = this_05 != (LabelInstr *)0x0;
      this_05 = pLVar22;
      if (bVar11) {
        return;
      }
    }
    else {
      this_00 = (pLVar22->super_Instr).m_dst;
      if (this_00 != (Opnd *)0x0) {
        bVar11 = IR::Opnd::IsRegOpnd(this_00);
        if (!bVar11) {
          return;
        }
        this_03 = IR::Opnd::AsRegOpnd((pLVar22->super_Instr).m_dst);
        pSVar18 = IR::Opnd::GetStackSym(&this_03->super_Opnd);
        BVSparse<Memory::JitArenaAllocator>::Set(this_02,(pSVar18->super_Sym).m_id);
        bVar11 = IsCopyTypeInstr(&pLVar22->super_Instr);
        if (bVar11) {
          pVVar19 = UpdateValueForCopyTypeInstr(this,globOpt,this_01,&pLVar22->super_Instr);
          if ((pVVar19 == (Value *)0x0) && ((pLVar22->super_Instr).m_opcode == LdFld)) {
            return;
          }
        }
        else {
          pSVar18 = IR::Opnd::GetStackSym((pLVar22->super_Instr).m_dst);
          ppVVar20 = ValueHashTable<Sym_*,_Value_*>::FindOrInsertNew(this_01,&pSVar18->super_Sym);
          *ppVVar20 = (Value *)0x0;
        }
      }
    }
    if ((pLVar22->super_Instr).m_kind == InstrKindBranch) break;
    pLVar22 = (LabelInstr *)(pLVar22->super_Instr).m_next;
  }
  pBVar21 = IR::Instr::AsBranchInstr(&pLVar22->super_Instr);
  bVar11 = IR::BranchInstr::IsUnconditional(pBVar21);
  pLVar22 = pBVar21->m_branchTarget;
  pBVar29 = this_02;
  if (bVar11) {
    if (pLVar22 == (LabelInstr *)0x0) {
      return;
    }
    if ((pLVar22->field_0x78 & 1) != 0) {
      return;
    }
  }
  else {
    if ((pLVar22->field_0x78 & 1) != 0) {
      return;
    }
    pLVar22 = CanProveConditionalBranch(this,pBVar21,globOpt,this_01);
    if (pLVar22 == (LabelInstr *)0x0) {
      return;
    }
  }
  while (pBVar29 = (BVSparse<Memory::JitArenaAllocator> *)pBVar29->head,
        pBVar29 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    TVar3 = *(Type *)&pBVar29->lastFoundIndex;
    local_90 = (undefined1  [8])((Type *)&pBVar29->alloc)->word;
    while (local_90 != (undefined1  [8])0x0) {
      lVar16 = 0;
      if (local_90 != (undefined1  [8])0x0) {
        for (; ((ulong)local_90 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
        }
      }
      BVUnitT<unsigned_long>::Clear((BVUnitT<unsigned_long> *)local_90,(BVIndex)lVar16);
      BVar12 = BVSparse<Memory::JitArenaAllocator>::Test
                         (pLVar22->m_block->upwardExposedUses,TVar3 + (BVIndex)lVar16);
      if (BVar12 != '\0') {
        return;
      }
    }
  }
  uVar14 = Func::GetSourceContextId(*ppFVar1);
  uVar15 = Func::GetLocalFunctionId(*ppFVar1);
  bVar11 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,PathDepBranchFoldingPhase,uVar14,uVar15);
  lVar16 = 0x18;
  if ((bVar11) && (bVar11 = IR::BranchInstr::IsUnconditional(pBVar21), !bVar11)) {
    Output::Print(L"TRACE PathDependentBranchFolding: ");
    pBVar23 = this->next;
    ppFVar27 = (Func **)&pBVar23->firstInstr;
    if (pBVar23 == (BasicBlock *)0x0) {
      ppFVar27 = ppFVar1;
    }
    uVar13 = this->number;
    if (pBVar23 == (BasicBlock *)0x0) {
      lVar16 = 0xd0;
    }
    pIVar8 = *(Instr **)((long)&(*ppFVar27)->m_alloc + lVar16);
    if (pIVar8->m_kind == InstrKindBranch) {
      pBVar21 = IR::Instr::AsBranchInstr(pIVar8);
      pBVar23 = pBVar21->m_branchTarget->m_block;
    }
    else {
      pBVar23 = GetNext(this);
    }
    uVar4 = pBVar23->number;
    uVar5 = pLVar22->m_block->number;
    this_04 = Func::GetJITFunctionBody(*ppFVar1);
    pcVar24 = JITTimeFunctionBody::GetDisplayName(this_04);
    Output::Print(L"Can prove retarget of branch in Block %d from Block %d to Block %d in func %s\n"
                  ,uVar13,(ulong)uVar4,(ulong)uVar5,pcVar24);
    if (globOpt->prePassLoop != (Loop *)0x0) {
      Output::Print(L"In LoopPrePass\n");
    }
    Output::Flush();
  }
  lVar25 = 0x18;
  pBVar23 = this->next;
  lVar16 = lVar25;
  ppFVar27 = (Func **)&pBVar23->firstInstr;
  if (pBVar23 == (BasicBlock *)0x0) {
    lVar16 = 0xd0;
    ppFVar27 = ppFVar1;
  }
  pIVar8 = *(Instr **)((long)&(*ppFVar27)->m_alloc + lVar16);
  if (pIVar8->m_kind == InstrKindBranch) goto code_r0x003ffdab;
  goto LAB_003ffdd3;
code_r0x003ffdab:
  pBVar21 = IR::Instr::AsBranchInstr(pIVar8);
  if (pBVar21->m_branchTarget == pLVar22) goto LAB_003ffab5;
  pBVar23 = this->next;
LAB_003ffdd3:
  ppFVar27 = (Func **)&pBVar23->firstInstr;
  if (pBVar23 == (BasicBlock *)0x0) {
    lVar25 = 0xd0;
    ppFVar27 = ppFVar1;
  }
  pLVar17 = (LabelInstr *)
            IR::Instr::GetNextRealInstrOrLabel(*(Instr **)((long)&(*ppFVar27)->m_alloc + lVar25));
  pBVar23 = this->next;
  ppFVar27 = (Func **)&pBVar23->firstInstr;
  if (pBVar23 == (BasicBlock *)0x0) {
    ppFVar27 = ppFVar1;
  }
  lVar16 = 0x18;
  if (pBVar23 == (BasicBlock *)0x0) {
    lVar16 = 0xd0;
  }
  pIVar8 = *(Instr **)((long)&(*ppFVar27)->m_alloc + lVar16);
  if (pLVar22 == pLVar17) {
    GlobOpt::ConvertToByteCodeUses(globOpt,pIVar8);
  }
  else {
    func = pIVar8->m_func;
    offset = IR::Instr::GetByteCodeOffset(pIVar8);
    instr = IR::ByteCodeUsesInstr::New(func,offset);
    IR::Instr::InsertAfter(pIVar8,&instr->super_Instr);
    pBVar21 = IR::BranchInstr::New(Br,pLVar22,(pLVar22->super_Instr).m_func);
    if (pIVar8->m_kind == InstrKindBranch) {
      GlobOpt::ConvertToByteCodeUses(globOpt,pIVar8);
    }
    IR::Instr::InsertAfter(&instr->super_Instr,&pBVar21->super_Instr);
    FlowGraph::AddEdge(globOpt->func->m_fg,this,pLVar22->m_block);
    this->dataUseCount = this->dataUseCount + 1;
  }
  lVar16 = 0x18;
  if (this_05 != (LabelInstr *)0x0) {
    if (this_05 == local_58) goto LAB_003fff0c;
    ppFVar27 = (Func **)&this->next->firstInstr;
    if (this->next == (BasicBlock *)0x0) {
      lVar16 = 0xd0;
      ppFVar27 = ppFVar1;
    }
    pIVar8 = *(Instr **)((long)&(*ppFVar27)->m_alloc + lVar16);
    instr_00 = IR::Instr::Copy(&this_05->super_Instr,true);
    IR::Instr::InsertBefore(pIVar8,instr_00);
    GlobOpt::ProcessInlineeEnd(globOpt,&this_05->super_Instr);
  }
  this_05 = (LabelInstr *)0x0;
LAB_003fff0c:
  iter.super_Iterator.current = (NodeBase *)0x0;
  local_90 = (undefined1  [8])&this->succList;
  iter.super_Iterator.list =
       &(this->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
  while( true ) {
    bVar11 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                       ((EditingIterator *)local_90);
    if (!bVar11) break;
    ppFVar26 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                         ((Iterator *)local_90);
    pBVar23 = (*ppFVar26)->succBlock;
    if (pBVar23 == (BasicBlock *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      pNVar10 = iter.last;
      *(undefined4 *)&(iter.last)->next = 1;
      bVar11 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                          ,0x12fc,"(blockSucc)","blockSucc");
      if (!bVar11) goto LAB_0040006e;
      *(undefined4 *)&pNVar10->next = 0;
    }
    pLVar17 = IR::Instr::AsLabelInstr(pBVar23->firstInstr);
    if (pLVar22 != pLVar17) {
      RemoveDeadSucc(this,pBVar23,globOpt->func->m_fg);
      if (this->dataUseCount != 0) {
        DecrementDataUseCount(this);
      }
      if ((pBVar23->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
          super_RealCount.count == 0) {
        FlowGraph::RemoveBlock((*ppFVar1)->m_fg,pBVar23,globOpt,false);
      }
    }
  }
  uVar14 = Func::GetSourceContextId((pLVar22->super_Instr).m_func);
  uVar15 = Func::GetLocalFunctionId((pLVar22->super_Instr).m_func);
  bVar11 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,PathDepBranchFoldingPhase,uVar14,uVar15);
  if ((bVar11) && (DAT_0145948a == '\x01')) {
    Output::Print(L"After PathDependentBranchFolding: ");
    Func::Dump(*ppFVar1);
  }
  goto LAB_003ffab5;
}

Assistant:

void
BasicBlock::CheckLegalityAndFoldPathDepBranches(GlobOpt* globOpt)
{
    IR::LabelInstr * lastBranchTarget = nullptr;
    IR::Instr *currentInlineeEnd = nullptr, *unskippedInlineeEnd = nullptr;
    GlobHashTable * localSymToValueMap = nullptr;
    BVSparse<JitArenaAllocator> * currentPathDefines = nullptr;

    FOREACH_INSTR_IN_BLOCK(instr, this)
    {
        if (OpCodeAttr::HasDeadFallThrough(instr->m_opcode))
        {
            return;
        }
        if (instr->m_opcode == Js::OpCode::InlineeEnd)
        {
            unskippedInlineeEnd = currentInlineeEnd = instr;
        }
    } NEXT_INSTR_IN_BLOCK;

    IR::Instr * instr = this->GetLastInstr();

    // We have to first check the legality and only then allocate expensive data structures on the tempArena, because most block will have instructions we cant skip
    if (!IsLegalForPathDepBranches(instr))
    {
        return;
    }

    // Allocate hefty structures, we will not free them because OptBlock does a Reset on the tempAlloc
    localSymToValueMap = GlobHashTable::New(globOpt->tempAlloc, 8);
    currentPathDefines = JitAnew(globOpt->tempAlloc, BVSparse<JitArenaAllocator>, globOpt->tempAlloc);

    /* We start from the current instruction and go on scanning for legality, as long as it is legal to skip an instruction, skip.
     * When we see an unconditional branch, start scanning from the branchTarget
     * When we see a conditional branch, check if we can prove the branch target, if we can, adjust the flowgraph, and continue in the direction of the proven target
     * We stop, when we no longer can skip instructions, either due to legality check or a non provable conditional branch
    */
    while (instr)
    {
        if (!instr->IsBranchInstr() && !instr->IsLabelInstr() && !IsLegalOpcodeForPathDepBrFold(instr))
        {
            return;
        }
        if (OpCodeAttr::HasDeadFallThrough(instr->m_opcode)) // BailOnNoProfile etc
        {
            return;
        }
        if (instr->IsLabelInstr())
        {
            if (instr->AsLabelInstr()->m_isLoopTop)
            {
                // don't cross over to loops
                return;
            }
        }
        if (instr->m_opcode == Js::OpCode::InlineeEnd)
        {
            if (currentInlineeEnd != nullptr)
            {
                return;
            }
            currentInlineeEnd = instr;
        }
        else if (instr->GetDst())
        {
            if (!instr->GetDst()->IsRegOpnd()) // complex dstOpnd, stop.
            {
                return;
            }

            IR::RegOpnd *dst = instr->GetDst()->AsRegOpnd();
            currentPathDefines->Set(dst->GetStackSym()->m_id);

            if (IsCopyTypeInstr(instr))
            {
                Value *dstValue = UpdateValueForCopyTypeInstr(globOpt, localSymToValueMap, instr);
                if (instr->m_opcode == Js::OpCode::LdFld && !dstValue)
                {
                    // We cannot skip a LdFld if we didnt find its valueInfo in the localValueTable
                    return;
                }
            }
            else
            {
                Value ** localDstValue = localSymToValueMap->FindOrInsertNew(instr->GetDst()->GetStackSym());
                *localDstValue = nullptr;
            }
        }

        if (instr->IsBranchInstr())
        {
            IR::BranchInstr* branch = instr->AsBranchInstr();
            IR::LabelInstr* branchTarget = nullptr;

            if (branch->IsUnconditional())
            {
                branchTarget = branch->GetTarget();
                if (!branchTarget)
                {
                    return;
                }
                if (branchTarget->m_isLoopTop)
                {
                    return;
                }
            }
            else
            {
                if (branch->GetTarget()->m_isLoopTop)
                {
                    return;
                }
                branchTarget = CanProveConditionalBranch(branch, globOpt, localSymToValueMap);
                if (!branchTarget)
                {
                    return;
                }
            }

            FOREACH_BITSET_IN_SPARSEBV(id, currentPathDefines)
            {
                if (branchTarget->GetBasicBlock()->upwardExposedUses->Test(id))
                {
                    // it is used in the direction of the branch, we can't skip it
                    return;
                }
            } NEXT_BITSET_IN_SPARSEBV;

            if (PHASE_TRACE(Js::PathDepBranchFoldingPhase, this->func))
            {
                if (!branch->IsUnconditional())
                {
                    Output::Print(_u("TRACE PathDependentBranchFolding: "));
                    Output::Print(_u("Can prove retarget of branch in Block %d from Block %d to Block %d in func %s\n"),
                        this->GetBlockNum(),
                        this->GetLastInstr()->IsBranchInstr() ? this->GetLastInstr()->AsBranchInstr()->GetTarget()->GetBasicBlock()->GetBlockNum() : this->GetNext()->GetBlockNum(),
                        branchTarget->GetBasicBlock()->GetBlockNum(),
                        this->func->GetJITFunctionBody()->GetDisplayName());
                    if (globOpt->IsLoopPrePass())
                    {
                        Output::Print(_u("In LoopPrePass\n"));
                    }
                    Output::Flush();
                }
            }

            if (this->GetLastInstr()->IsBranchInstr() && (this->GetLastInstr()->AsBranchInstr()->GetTarget() == branchTarget))
            {
                // happens on the first block we start from only
                lastBranchTarget = branchTarget;
                instr = lastBranchTarget;
                continue;
            }
            if (branchTarget != this->GetLastInstr()->GetNextRealInstrOrLabel())
            {
                IR::Instr* lastInstr = this->GetLastInstr();
                // We add an empty ByteCodeUses with correct bytecodeoffset, for correct info on a post-op bailout of the previous instr
                IR::Instr* emptyByteCodeUse = IR::ByteCodeUsesInstr::New(lastInstr->m_func, lastInstr->GetByteCodeOffset());
                lastInstr->InsertAfter(emptyByteCodeUse);
                IR::BranchInstr * newBranch = IR::BranchInstr::New(Js::OpCode::Br, branchTarget, branchTarget->m_func);
                if (lastInstr->IsBranchInstr())
                {
                    globOpt->ConvertToByteCodeUses(lastInstr);
                }
                emptyByteCodeUse->InsertAfter(newBranch);
                globOpt->func->m_fg->AddEdge(this, branchTarget->GetBasicBlock());
                this->IncrementDataUseCount();
            }
            else
            {
                // If the new target is a fall through label, delete the branch
                globOpt->ConvertToByteCodeUses(this->GetLastInstr());
            }
            if (currentInlineeEnd != nullptr && currentInlineeEnd != unskippedInlineeEnd)
            {
                this->GetLastInstr()->InsertBefore(currentInlineeEnd->Copy());
                globOpt->ProcessInlineeEnd(currentInlineeEnd);
                currentInlineeEnd = nullptr;
            }
            // We are adding an unconditional branch, go over all the current successors and remove the ones that are dead now
            FOREACH_SUCCESSOR_BLOCK_EDITING(blockSucc, this, iter)
            {
                if (branchTarget != blockSucc->GetFirstInstr()->AsLabelInstr())
                {
                    // Change the old succ edge to dead
                    this->RemoveDeadSucc(blockSucc, globOpt->func->m_fg);
                    if (this->GetDataUseCount() > 0)
                    {
                        this->DecrementDataUseCount();
                    }
                    if (blockSucc->GetPredList()->Count() == 0)
                    {
                        this->func->m_fg->RemoveBlock(blockSucc, globOpt);
                    }
                }
            }NEXT_SUCCESSOR_BLOCK_EDITING;
            lastBranchTarget = branchTarget;
            instr = lastBranchTarget;
#if DBG
            if (PHASE_TRACE(Js::PathDepBranchFoldingPhase, instr->m_func) && Js::Configuration::Global.flags.Verbose)
            {
                Output::Print(_u("After PathDependentBranchFolding: "));
                this->func->Dump();
            }
#endif
        }
        else
        {
            instr = instr->m_next;
        }
    }

    return;
}